

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoInline.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::NoInline::run(NoInline *this,Module *module)

{
  string *psVar1;
  NoInlineMode NVar2;
  pointer puVar3;
  bool bVar4;
  pointer puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string pattern;
  
  psVar1 = &(this->super_Pass).name;
  std::operator+(&local_98,"Usage usage:  wasm-opt --",psVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pattern.field_2 + 8),&local_98,"=WILDCARD");
  Pass::getArgument((string *)local_78,&this->super_Pass,psVar1,
                    (string *)((long)&pattern.field_2 + 8));
  psVar1 = (string *)(pattern.field_2._M_local_buf + 8);
  std::__cxx11::string::~string((string *)psVar1);
  std::__cxx11::string::~string((string *)&local_98);
  puVar3 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (module->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    IString::toString_abi_cxx11_
              (psVar1,(IString *)
                      (puVar5->_M_t).
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    bVar4 = String::wildcardMatch((string *)local_78,psVar1);
    std::__cxx11::string::~string((string *)psVar1);
    if (bVar4) {
      NVar2 = this->mode;
      if ((NVar2 & ~Both) == Full) {
        ((puVar5->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->noFullInline = true;
      }
      if (NVar2 - Partial < 2) {
        ((puVar5->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->noPartialInline = true;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void run(Module* module) override {
    std::string pattern =
      getArgument(name, "Usage usage:  wasm-opt --" + name + "=WILDCARD");

    for (auto& func : module->functions) {
      if (!String::wildcardMatch(pattern, func->name.toString())) {
        continue;
      }

      if (mode == Full || mode == Both) {
        func->noFullInline = true;
      }
      if (mode == Partial || mode == Both) {
        func->noPartialInline = true;
      }
    }
  }